

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_sasl_mechanisms(AMQP_VALUE value,SASL_MECHANISMS_HANDLE *sasl_mechanisms_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  SASL_MECHANISMS_HANDLE pSVar3;
  AMQP_VALUE pAVar4;
  uint32_t list_item_count;
  char *sasl_server_mechanisms;
  AMQP_VALUE sasl_server_mechanisms_array;
  
  pSVar3 = (SASL_MECHANISMS_HANDLE)malloc(8);
  if (pSVar3 == (SASL_MECHANISMS_HANDLE)0x0) {
    *sasl_mechanisms_handle = (SASL_MECHANISMS_HANDLE)0x0;
    return 0x27ff;
  }
  pSVar3->composite_value = (AMQP_VALUE)0x0;
  *sasl_mechanisms_handle = pSVar3;
  pAVar4 = amqpvalue_get_inplace_described_value(value);
  if (pAVar4 == (AMQP_VALUE)0x0) {
    sasl_mechanisms_destroy(*sasl_mechanisms_handle);
    return 0x2807;
  }
  iVar1 = amqpvalue_get_list_item_count(pAVar4,&list_item_count);
  if (iVar1 != 0) {
    return 0x280e;
  }
  if (list_item_count != 0) {
    pAVar4 = amqpvalue_get_list_item(pAVar4,0);
    if (pAVar4 == (AMQP_VALUE)0x0) {
      sasl_mechanisms_destroy(*sasl_mechanisms_handle);
      return 0x281d;
    }
    AVar2 = amqpvalue_get_type(pAVar4);
    if (AVar2 != AMQP_TYPE_NULL) {
      sasl_server_mechanisms = (char *)0x0;
      AVar2 = amqpvalue_get_type(pAVar4);
      if (((AVar2 != AMQP_TYPE_ARRAY) ||
          (iVar1 = amqpvalue_get_array(pAVar4,&sasl_server_mechanisms_array), iVar1 != 0)) &&
         (iVar1 = amqpvalue_get_symbol(pAVar4,&sasl_server_mechanisms), iVar1 != 0)) {
        amqpvalue_destroy(pAVar4);
        sasl_mechanisms_destroy(*sasl_mechanisms_handle);
        return 0x2833;
      }
      amqpvalue_destroy(pAVar4);
      pAVar4 = amqpvalue_clone(value);
      pSVar3->composite_value = pAVar4;
      return 0;
    }
    amqpvalue_destroy(pAVar4);
    sasl_mechanisms_destroy(*sasl_mechanisms_handle);
    return 0x2827;
  }
  return 0x283d;
}

Assistant:

int amqpvalue_get_sasl_mechanisms(AMQP_VALUE value, SASL_MECHANISMS_HANDLE* sasl_mechanisms_handle)
{
    int result;
    SASL_MECHANISMS_INSTANCE* sasl_mechanisms_instance = (SASL_MECHANISMS_INSTANCE*)sasl_mechanisms_create_internal();
    *sasl_mechanisms_handle = sasl_mechanisms_instance;
    if (*sasl_mechanisms_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_mechanisms_destroy(*sasl_mechanisms_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* sasl-server-mechanisms */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_mechanisms_destroy(*sasl_mechanisms_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_mechanisms_destroy(*sasl_mechanisms_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* sasl_server_mechanisms = NULL;
                                AMQP_VALUE sasl_server_mechanisms_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &sasl_server_mechanisms_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &sasl_server_mechanisms) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_mechanisms_destroy(*sasl_mechanisms_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    sasl_mechanisms_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}